

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeKernelSuggestGroupSizePrologue
          (ZEParameterValidation *this,ze_kernel_handle_t hKernel,uint32_t globalSizeX,
          uint32_t globalSizeY,uint32_t globalSizeZ,uint32_t *groupSizeX,uint32_t *groupSizeY,
          uint32_t *groupSizeZ)

{
  ze_result_t zVar1;
  
  if (hKernel == (ze_kernel_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if (groupSizeY != (uint32_t *)0x0 && groupSizeX != (uint32_t *)0x0) {
      zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
      if (groupSizeZ != (uint32_t *)0x0) {
        zVar1 = ZE_RESULT_SUCCESS;
      }
      return zVar1;
    }
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeKernelSuggestGroupSizePrologue(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        uint32_t globalSizeX,                           ///< [in] global width for X dimension
        uint32_t globalSizeY,                           ///< [in] global width for Y dimension
        uint32_t globalSizeZ,                           ///< [in] global width for Z dimension
        uint32_t* groupSizeX,                           ///< [out] recommended size of group for X dimension
        uint32_t* groupSizeY,                           ///< [out] recommended size of group for Y dimension
        uint32_t* groupSizeZ                            ///< [out] recommended size of group for Z dimension
        )
    {
        if( nullptr == hKernel )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == groupSizeX )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == groupSizeY )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == groupSizeZ )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }